

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

void cmd_ln_set_str_r(cmd_ln_t *cmdln,char *name,char *str)

{
  anytype_t *paVar1;
  char *pcVar2;
  anytype_t *val;
  char *str_local;
  char *name_local;
  cmd_ln_t *cmdln_local;
  
  paVar1 = cmd_ln_access_r(cmdln,name);
  if (paVar1 == (anytype_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x3e1,"Unknown argument: %s\n",name);
  }
  else {
    ckd_free(paVar1->ptr);
    pcVar2 = __ckd_salloc__(str,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x3e5);
    paVar1->ptr = pcVar2;
  }
  return;
}

Assistant:

void
cmd_ln_set_str_r(cmd_ln_t *cmdln, char const *name, char const *str)
{
    anytype_t *val;
    val = cmd_ln_access_r(cmdln, name);
    if (val == NULL) {
        E_ERROR("Unknown argument: %s\n", name);
        return;
    }
    ckd_free(val->ptr);
    val->ptr = ckd_salloc(str);
}